

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O2

int sprkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  ARKodeSPRKStepMem pAVar1;
  int iVar2;
  int line;
  ARKodeSPRKStepMem step_mem;
  
  step_mem = (ARKodeSPRKStepMem)0x0;
  iVar2 = sprkStep_AccessStepMem(ark_mem,"sprkStep_FullRHS",&step_mem);
  pAVar1 = step_mem;
  if (iVar2 == 0) {
    if ((uint)mode < 3) {
      iVar2 = (*step_mem->f1)(t,y,f,ark_mem->user_data);
      pAVar1->nf1 = pAVar1->nf1 + 1;
      if (iVar2 == 0) {
        iVar2 = (*pAVar1->f2)(t,y,f,ark_mem->user_data);
        pAVar1->nf2 = pAVar1->nf2 + 1;
        if (iVar2 == 0) {
          return 0;
        }
        line = 0x1f8;
      }
      else {
        line = 0x1f0;
      }
      iVar2 = -8;
      arkProcessError(ark_mem,-8,line,"sprkStep_FullRHS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,
                      "At t = %.15g, the right-hand side routine failed in an unrecoverable manner."
                      ,t);
    }
    else {
      iVar2 = -8;
      arkProcessError(ark_mem,-8,0x201,"sprkStep_FullRHS",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,"Unknown full RHS mode");
    }
  }
  return iVar2;
}

Assistant:

int sprkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                     int mode)
{
  int retval                 = 0;
  ARKodeSPRKStepMem step_mem = NULL;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:
  case ARK_FULLRHS_END:
  case ARK_FULLRHS_OTHER:

    /* Since f1 and f2 do not have overlapping outputs and so the f vector is
       passed to both RHS functions. */

    retval = sprkStep_f1(step_mem, t, y, f, ark_mem->user_data);
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return (ARK_RHSFUNC_FAIL);
    }

    retval = sprkStep_f2(step_mem, t, y, f, ark_mem->user_data);
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return (ARK_RHSFUNC_FAIL);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}